

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall
rsg::IntLiteral::IntLiteral(IntLiteral *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  bool bVar2;
  VariableType *pVVar3;
  Random *this_00;
  int *piVar4;
  ConstStridedValueAccess<64> CVar5;
  int local_ec;
  undefined1 auStack_e8 [4];
  int ndx;
  ExecValueAccess access;
  Scalar local_d0;
  int value;
  Scalar local_c8;
  Scalar local_c4;
  ConstValueAccess local_c0;
  ConstStridedValueAccess<1> local_b0;
  ConstValueAccess local_a0;
  ConstStridedValueAccess<1> local_90;
  VariableType local_80;
  int local_2c;
  int local_28;
  int maxVal;
  int minVal;
  GeneratorState *local_18;
  GeneratorState *state_local;
  IntLiteral *this_local;
  
  local_18 = state;
  state_local = (GeneratorState *)this;
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__IntLiteral_00cbe298;
  pVVar3 = VariableType::getScalarType(TYPE_INT);
  ValueStorage<64>::ValueStorage(&this->m_value,pVVar3);
  local_28 = -0x10;
  local_2c = 0x10;
  pVVar3 = ConstValueRangeAccess::getType(&valueRange);
  VariableType::VariableType(&local_80,TYPE_INT,1);
  bVar2 = VariableType::operator==(pVVar3,&local_80);
  VariableType::~VariableType(&local_80);
  if (bVar2) {
    local_a0 = ConstValueRangeAccess::getMin(&valueRange);
    local_90 = ConstStridedValueAccess<1>::component(&local_a0,0);
    local_28 = ConstStridedValueAccess<1>::asInt(&local_90);
    local_c0 = ConstValueRangeAccess::getMax(&valueRange);
    local_b0 = ConstStridedValueAccess<1>::component(&local_c0,0);
    local_2c = ConstStridedValueAccess<1>::asInt(&local_b0);
    local_c4 = Scalar::min<int>();
    Scalar::Scalar((Scalar *)&local_c8.boolVal,local_28);
    bVar2 = Scalar::operator==((Scalar *)&local_c4.boolVal,local_c8);
    if (bVar2) {
      local_28 = -0x10;
    }
    value = (int)Scalar::max<int>();
    Scalar::Scalar((Scalar *)&local_d0.boolVal,local_2c);
    bVar2 = Scalar::operator==((Scalar *)&value,local_d0);
    if (bVar2) {
      local_2c = 0x10;
    }
  }
  this_00 = GeneratorState::getRandom(local_18);
  access.super_ConstStridedValueAccess<64>.m_value._4_4_ =
       de::Random::getInt(this_00,local_28,local_2c);
  pVVar3 = VariableType::getScalarType(TYPE_INT);
  CVar5 = (ConstStridedValueAccess<64>)ValueStorage<64>::getValue(&this->m_value,pVVar3);
  local_ec = 0;
  while( true ) {
    iVar1 = access.super_ConstStridedValueAccess<64>.m_value._4_4_;
    access.super_ConstStridedValueAccess<64>.m_type = (VariableType *)CVar5.m_value;
    _auStack_e8 = CVar5.m_type;
    if (0x3f < local_ec) break;
    piVar4 = StridedValueAccess<64>::asInt((StridedValueAccess<64> *)auStack_e8,local_ec);
    CVar5.m_value = (Scalar *)access.super_ConstStridedValueAccess<64>.m_type;
    CVar5.m_type = _auStack_e8;
    *piVar4 = iVar1;
    local_ec = local_ec + 1;
  }
  return;
}

Assistant:

IntLiteral::IntLiteral (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_value(VariableType::getScalarType(VariableType::TYPE_INT))
{
	int minVal = -16;
	int maxVal = +16;

	if (valueRange.getType() == VariableType(VariableType::TYPE_INT, 1))
	{
		minVal = valueRange.getMin().component(0).asInt();
		maxVal = valueRange.getMax().component(0).asInt();

		if (Scalar::min<int>() == minVal)
			minVal = -16;

		if (Scalar::max<int>() == maxVal)
			maxVal = 16;
	}

	int				value	= state.getRandom().getInt(minVal, maxVal);
	ExecValueAccess	access	= m_value.getValue(VariableType::getScalarType(VariableType::TYPE_INT));

	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		access.asInt(ndx) = value;
}